

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# RealSchur.h
# Opt level: O0

void __thiscall
Eigen::RealSchur<Eigen::Matrix<double,_2,_2,_0,_2,_2>_>::RealSchur
          (RealSchur<Eigen::Matrix<double,_2,_2,_0,_2,_2>_> *this,Index size)

{
  HessenbergDecomposition<Eigen::Matrix<double,_2,_2,_0,_2,_2>_> *in_RSI;
  long *in_RDI;
  Matrix<double,_2,_2,_0,_2,_2> *unaff_retaddr;
  long *x;
  
  x = in_RDI;
  Matrix<double,2,2,0,2,2>::Matrix<long,long>(unaff_retaddr,in_RDI,(long *)in_RSI);
  Matrix<double,2,2,0,2,2>::Matrix<long,long>(unaff_retaddr,x,(long *)in_RSI);
  Matrix<double,_2,_1,_0,_2,_1>::Matrix((Matrix<double,_2,_1,_0,_2,_1> *)in_RSI,(Index)in_RDI);
  HessenbergDecomposition<Eigen::Matrix<double,_2,_2,_0,_2,_2>_>::HessenbergDecomposition
            (in_RSI,(Index)in_RDI);
  *(undefined1 *)((long)in_RDI + 0xa4) = 0;
  *(undefined1 *)((long)in_RDI + 0xa5) = 0;
  in_RDI[0x15] = -1;
  return;
}

Assistant:

RealSchur(Index size = RowsAtCompileTime==Dynamic ? 1 : RowsAtCompileTime)
            : m_matT(size, size),
              m_matU(size, size),
              m_workspaceVector(size),
              m_hess(size),
              m_isInitialized(false),
              m_matUisUptodate(false),
              m_maxIters(-1)
    { }